

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::DrawTestBase::setup4x4Scissor
          (DrawTestBase *this,SCISSOR_METHOD method,bool set_zeros)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  uint local_150;
  GLuint i_2;
  GLint h;
  GLint w;
  GLint y_1;
  GLint x_1;
  GLuint i_1;
  GLuint x;
  GLuint y;
  GLint height;
  GLint width;
  GLint data [64];
  GLint index;
  GLuint i;
  Functions *gl;
  bool set_zeros_local;
  SCISSOR_METHOD method_local;
  DrawTestBase *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  for (data[0x3f] = 0; (uint)data[0x3f] < 0x10; data[0x3f] = data[0x3f] + 1) {
    (**(code **)(lVar4 + 0x618))(0xc11,data[0x3f]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Enablei",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xc3b);
  }
  data[0x3e] = 0;
  for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
    for (x_1 = 0; (uint)x_1 < 4; x_1 = x_1 + 1) {
      (&height)[data[0x3e] << 2] = x_1 * 0x20;
      (&height)[data[0x3e] * 4 + 1] = i_1 * 0x20;
      if (set_zeros) {
        (&height)[data[0x3e] * 4 + 2] = 0;
        (&height)[data[0x3e] * 4 + 3] = 0;
      }
      else {
        (&height)[data[0x3e] * 4 + 2] = 0x20;
        (&height)[data[0x3e] * 4 + 3] = 0x20;
      }
      data[0x3e] = data[0x3e] + 1;
    }
  }
  if (method == SCISSORARRAYV) {
    (**(code **)(lVar4 + 0x1298))(0,0x10,&height);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"ScissorArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xc5d);
  }
  else if (method == SCISSORINDEXEDF) {
    for (y_1 = 0; (uint)y_1 < 0x10; y_1 = y_1 + 1) {
      (**(code **)(lVar4 + 0x12a0))
                (y_1,(&height)[(uint)(y_1 << 2)],(&height)[y_1 * 4 + 1],(&height)[y_1 * 4 + 2],
                 (&height)[y_1 * 4 + 3]);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"ScissorIndexed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xc68);
    }
  }
  else {
    if (method != SCISSORINDEXEDF_V) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xc73);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    for (local_150 = 0; local_150 < 0x10; local_150 = local_150 + 1) {
      (**(code **)(lVar4 + 0x12a8))(local_150,&height + (local_150 << 2));
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"ScissorIndexedv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xc6f);
    }
  }
  return;
}

Assistant:

void DrawTestBase::setup4x4Scissor(SCISSOR_METHOD method, bool set_zeros)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLuint i = 0; i < 16; ++i)
	{
		gl.enablei(GL_SCISSOR_TEST, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Enablei");
	}

	GLint index = 0;
	GLint data[16 * 4 /* 4x4 * (x + y + w + h) */];

	GLint width  = m_width / 4;
	GLint height = m_height / 4;

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			data[index * 4 + 0] = x * width;
			data[index * 4 + 1] = y * height;
			if (false == set_zeros)
			{
				data[index * 4 + 2] = width;
				data[index * 4 + 3] = height;
			}
			else
			{
				data[index * 4 + 2] = 0;
				data[index * 4 + 3] = 0;
			}

			index += 1;
		}
	}

	switch (method)
	{
	case SCISSORARRAYV:
		gl.scissorArrayv(0 /* first */, 16 /*count */, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ScissorArrayv");
		break;
	case SCISSORINDEXEDF:
		for (GLuint i = 0; i < 16; ++i)
		{
			const GLint x = data[i * 4 + 0];
			const GLint y = data[i * 4 + 1];
			const GLint w = data[i * 4 + 2];
			const GLint h = data[i * 4 + 3];

			gl.scissorIndexed(i, x, y, w, h);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ScissorIndexed");
		}
		break;
	case SCISSORINDEXEDF_V:
		for (GLuint i = 0; i < 16; ++i)
		{
			gl.scissorIndexedv(i, &data[i * 4]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ScissorIndexedv");
		}
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}